

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O0

LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::operator-=
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *Value)

{
  KFIXED<char,_(unsigned_char)__x03_> local_b8;
  KFIXED<char,_(unsigned_char)__x03_> local_a8;
  KFIXED<char,_(unsigned_char)__x03_> local_98;
  KFIXED<char,_(unsigned_char)__x03_> local_88;
  KFIXED<char,_(unsigned_char)__x03_> local_78;
  KFIXED<char,_(unsigned_char)__x03_> local_68 [2];
  KFIXED<char,_(unsigned_char)__x03_> local_48;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  KFIXED<char,_(unsigned_char)__x03_> local_28;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *local_18;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *Value_local;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this_local;
  
  local_18 = Value;
  Value_local = this;
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_48,&Value->m_X);
  KFIXED<char,_(unsigned_char)'\x03'>::operator-(&local_38,&this->m_X);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_28,&this->m_X);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_28);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_48);
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_88,&local_18->m_Y);
  KFIXED<char,_(unsigned_char)'\x03'>::operator-(&local_78,&this->m_Y);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(local_68,&this->m_Y);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(local_68);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_78);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_88);
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_b8,&local_18->m_Z);
  KFIXED<char,_(unsigned_char)'\x03'>::operator-(&local_a8,&this->m_Z);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_98,&this->m_Z);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_98);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_a8);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_b8);
  return this;
}

Assistant:

LE_Vector<Type> & LE_Vector<Type>::operator -= ( const LE_Vector & Value )
{
    m_X = m_X - Value.m_X;
    m_Y = m_Y - Value.m_Y;
    m_Z = m_Z - Value.m_Z;
    return *this;
}